

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void gradtrans(double *raw,int p,int q,int P,int Q,int M,double *A)

{
  int iVar1;
  int iVar2;
  double eps;
  double w3 [100];
  double w2 [100];
  double w1 [100];
  int N;
  int v;
  int j;
  int i;
  int M_local;
  int Q_local;
  int P_local;
  int q_local;
  int p_local;
  double *raw_local;
  
  iVar1 = p + q + P + Q + M;
  for (v = 0; v < iVar1; v = v + 1) {
    for (N = 0; N < iVar1; N = N + 1) {
      if (v == N) {
        A[v + N * iVar1] = (double)v;
      }
    }
  }
  if (0 < p) {
    memcpy(w2 + 99,raw,(long)p << 3);
    artrans(p,w2 + 99,w3 + 99);
    for (v = 0; v < p; v = v + 1) {
      w2[(long)v + 99] = w2[(long)v + 99] + 0.001;
      artrans(p,w2 + 99,&eps);
      for (N = 0; N < p; N = N + 1) {
        A[v + N * iVar1] = (w3[(long)N + -1] - w3[(long)N + 99]) / 0.001;
      }
      w2[(long)v + 99] = w2[(long)v + 99] - 0.001;
    }
  }
  if (0 < q) {
    memcpy(w2 + 99,raw + p,(long)q << 3);
    artrans(q,w2 + 99,w3 + 99);
    for (v = 0; v < q; v = v + 1) {
      w2[(long)v + 99] = w2[(long)v + 99] + 0.001;
      artrans(q,w2 + 99,&eps);
      for (N = 0; N < q; N = N + 1) {
        A[v + N * iVar1 + p] = (w3[(long)N + -1] - w3[(long)N + 99]) / 0.001;
      }
      w2[(long)v + 99] = w2[(long)v + 99] - 0.001;
    }
  }
  if (0 < P) {
    iVar2 = p + q;
    memcpy(w2 + 99,raw + iVar2,(long)P << 3);
    artrans(P,w2 + 99,w3 + 99);
    for (v = 0; v < P; v = v + 1) {
      w2[(long)v + 99] = w2[(long)v + 99] + 0.001;
      artrans(P,w2 + 99,&eps);
      for (N = 0; N < P; N = N + 1) {
        A[v + (N + iVar2) * iVar1 + iVar2] = (w3[(long)N + -1] - w3[(long)N + 99]) / 0.001;
      }
      w2[(long)v + 99] = w2[(long)v + 99] - 0.001;
    }
  }
  if (0 < Q) {
    iVar2 = p + q + P;
    memcpy(w2 + 99,raw + iVar2,(long)Q << 3);
    artrans(Q,w2 + 99,w3 + 99);
    for (v = 0; v < Q; v = v + 1) {
      w2[(long)v + 99] = w2[(long)v + 99] + 0.001;
      artrans(Q,w2 + 99,&eps);
      for (N = 0; N < Q; N = N + 1) {
        A[v + (N + iVar2) * iVar1 + iVar2] = (w3[(long)N + -1] - w3[(long)N + 99]) / 0.001;
      }
      w2[(long)v + 99] = w2[(long)v + 99] - 0.001;
    }
  }
  return;
}

Assistant:

void gradtrans(double *raw, int p, int q, int P, int Q,int M, double *A) {
	int i, j, v, N;
	double w1[100], w2[100], w3[100];
	double eps = 1e-03;
	N = p + q + P + Q + M;

	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			if (i == j) {
				A[i + j*N] = (double)i;
			}
		}
	}

	if (p > 0) {
		memcpy(w1, raw, sizeof(double)*p);
		artrans(p, w1, w2);

		for (i = 0; i < p; ++i) {
			w1[i] += eps;
			artrans(p, w1, w3);
			for (j = 0; j < p; ++j) {
				A[i + j*N] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (q > 0) {
		v = p;
		memcpy(w1, raw+v, sizeof(double)*q);
		artrans(q, w1, w2);

		for (i = 0; i < q; ++i) {
			w1[i] += eps;
			artrans(q, w1, w3);
			for (j = 0; j < q; ++j) {
				A[i + j*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (P > 0) {
		v = p + q;
		memcpy(w1, raw + v, sizeof(double)*P);
		artrans(P, w1, w2);

		for (i = 0; i < P; ++i) {
			w1[i] += eps;
			artrans(P, w1, w3);
			for (j = 0; j < P; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (Q > 0) {
		v = p + q + P;
		memcpy(w1, raw + v, sizeof(double)*Q);
		artrans(Q, w1, w2);

		for (i = 0; i < Q; ++i) {
			w1[i] += eps;
			artrans(Q, w1, w3);
			for (j = 0; j < Q; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}
}